

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Name> *
wasm::WATParser::maybeMemuse<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  Lexer *this;
  char *pcVar1;
  bool bVar2;
  _Copy_ctor_base<false,_wasm::Name,_wasm::Err> *p_Var3;
  string_view expected;
  undefined1 auStack_b8 [8];
  Result<wasm::Name> idx;
  string local_70 [32];
  undefined1 local_50 [8];
  Result<wasm::Name> _val;
  
  this = &ctx->in;
  expected._M_str = "memory";
  expected._M_len = 6;
  bVar2 = Lexer::takeSExprStart(this,expected);
  if (bVar2) {
    memidx<wasm::WATParser::ParseDefsCtx>((Result<wasm::Name> *)auStack_b8,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_50,
               (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)auStack_b8);
    if (_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string(local_70,(string *)local_50);
      std::__detail::__variant::_Variant_storage<false,wasm::Name,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Name,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 local_70);
      std::__cxx11::string::~string(local_70);
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_50);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_50);
      bVar2 = Lexer::takeRParen(this);
      if (bVar2) {
        p_Var3 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)0x0;
        if (idx.val.super__Variant_base<wasm::Name,_wasm::Err>.
            super__Move_assign_alias<wasm::Name,_wasm::Err>.
            super__Copy_assign_alias<wasm::Name,_wasm::Err>.
            super__Move_ctor_alias<wasm::Name,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
            super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\0') {
          p_Var3 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)auStack_b8;
        }
        pcVar1 = (p_Var3->super__Variant_storage_alias<wasm::Name,_wasm::Err>)._M_u._M_first.
                 _M_storage.super_IString.str._M_str;
        *(size_t *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err> =
             (p_Var3->super__Variant_storage_alias<wasm::Name,_wasm::Err>)._M_u._M_first._M_storage.
             super_IString.str._M_len;
        *(char **)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err> + 8) =
             pcVar1;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20) = '\0';
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&idx.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
                   "expected end of memory use",(allocator<char> *)local_70);
        Lexer::err((Err *)local_50,this,
                   (string *)
                   ((long)&idx.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Name,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Name,wasm::None,wasm::Err> *)__return_storage_ptr__
                   ,local_50);
        std::__cxx11::string::~string((string *)local_50);
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&idx.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)auStack_b8);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::MemoryIdxT> maybeMemuse(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("memory"sv)) {
    return {};
  }
  auto idx = memidx(ctx);
  CHECK_ERR(idx);
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of memory use");
  }
  return *idx;
}